

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O0

PVG_FT_Error
ft_stroke_border_conicto(PVG_FT_StrokeBorder border,PVG_FT_Vector *control,PVG_FT_Vector *to)

{
  uint uVar1;
  PVG_FT_Byte *pPVar2;
  PVG_FT_Error PVar3;
  PVG_FT_Vector *pPVar4;
  PVG_FT_Byte *tag;
  PVG_FT_Vector *vec;
  PVG_FT_Error error;
  PVG_FT_Vector *to_local;
  PVG_FT_Vector *control_local;
  PVG_FT_StrokeBorder border_local;
  
  if (-1 < border->start) {
    PVar3 = ft_stroke_border_grow(border,2);
    if (PVar3 == 0) {
      pPVar4 = border->points + border->num_points;
      pPVar2 = border->tags;
      uVar1 = border->num_points;
      pPVar4->x = control->x;
      pPVar4->y = control->y;
      pPVar4[1].x = to->x;
      pPVar4[1].y = to->y;
      pPVar2[uVar1] = '\0';
      (pPVar2 + uVar1)[1] = '\x01';
      border->num_points = border->num_points + 2;
    }
    border->movable = '\0';
    return PVar3;
  }
  __assert_fail("border->start >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-ft-stroker.c"
                ,0x16a,
                "PVG_FT_Error ft_stroke_border_conicto(PVG_FT_StrokeBorder, PVG_FT_Vector *, PVG_FT_Vector *)"
               );
}

Assistant:

static PVG_FT_Error ft_stroke_border_conicto(PVG_FT_StrokeBorder border,
                                            PVG_FT_Vector*      control,
                                            PVG_FT_Vector*      to)
{
    PVG_FT_Error error;

    assert(border->start >= 0);

    error = ft_stroke_border_grow(border, 2);
    if (!error) {
        PVG_FT_Vector* vec = border->points + border->num_points;
        PVG_FT_Byte*   tag = border->tags + border->num_points;

        vec[0] = *control;
        vec[1] = *to;

        tag[0] = 0;
        tag[1] = PVG_FT_STROKE_TAG_ON;

        border->num_points += 2;
    }

    border->movable = FALSE;

    return error;
}